

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

nodemetalookuphead * BuildLookup(nodecontext *p,array *List)

{
  long local_88;
  nodemetalookuphead Head;
  nodemetalookuphead *v;
  array *List_local;
  nodecontext *p_local;
  
  if (List == (array *)0x0) {
    __assert_fail("&(*List)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x423,"nodemetalookuphead *BuildLookup(nodecontext *, array *)");
  }
  local_88 = (List->_Used >> 4) - 1;
  if (List == (array *)0x0) {
    __assert_fail("&(*List)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x424,"nodemetalookuphead *BuildLookup(nodecontext *, array *)");
  }
  Head.Upper = (size_t)(*p->NodeConstHeap->Alloc)(p->NodeConstHeap,List->_Used + 8);
  if ((void *)Head.Upper != (void *)0x0) {
    (*p->NodeConstHeap->Write)(p->NodeConstHeap,(void *)Head.Upper,&local_88,0,8);
    if (List == (array *)0x0) {
      __assert_fail("&(*List)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x428,"nodemetalookuphead *BuildLookup(nodecontext *, array *)");
    }
    if (List == (array *)0x0) {
      __assert_fail("&(*List)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x428,"nodemetalookuphead *BuildLookup(nodecontext *, array *)");
    }
    (*p->NodeConstHeap->Write)(p->NodeConstHeap,(void *)Head.Upper,List->_Begin,8,List->_Used);
  }
  ArrayClear(List);
  return (nodemetalookuphead *)Head.Upper;
}

Assistant:

static NOINLINE nodemetalookuphead* BuildLookup(nodecontext* p,array* List)
{
    nodemetalookuphead* v;
    nodemetalookuphead Head;
    Head.Upper = ARRAYCOUNT(*List,nodemetalookup)-1;
    v = MemHeap_Alloc(p->NodeConstHeap,sizeof(Head)+ARRAYCOUNT(*List,uint8_t));
    if (v)
    {
        MemHeap_Write(p->NodeConstHeap,v,&Head,0,sizeof(Head));
        MemHeap_Write(p->NodeConstHeap,v,ARRAYBEGIN(*List,nodemetalookup),sizeof(Head),ARRAYCOUNT(*List,uint8_t));
    }
    ArrayClear(List);
    return v;
}